

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_tooltip_begin(nk_context *ctx,float width)

{
  nk_flags *pnVar1;
  undefined4 uVar2;
  nk_vec2 nVar3;
  undefined4 uVar4;
  nk_window *pnVar5;
  nk_panel *pnVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  nk_rect rect;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x6207,"int nk_tooltip_begin(struct nk_context *, float)");
  }
  pnVar5 = ctx->current;
  if (pnVar5 != (nk_window *)0x0) {
    pnVar6 = pnVar5->layout;
    if (pnVar6 != (nk_panel *)0x0) {
      if (((pnVar5->popup).win == (nk_window *)0x0) ||
         (iVar7 = 0,
         ((pnVar5->popup).type & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL)
         ) == NK_PANEL_NONE)) {
        nVar3 = (ctx->input).mouse.pos;
        fVar8 = nVar3.x + 1.0;
        fVar9 = nVar3.y + 1.0;
        uVar2 = (pnVar6->clip).x;
        uVar4 = (pnVar6->clip).y;
        rect.x = (float)((int)(float)(int)((int)fVar8 - (uint)(fVar8 < 0.0)) - (int)(float)uVar2);
        rect.y = (float)((int)(float)(int)((int)fVar9 - (uint)(fVar9 < 0.0)) - (int)(float)uVar4);
        rect.w = (float)(int)((uint)((float)(int)width < width) + (int)width);
        rect.h = 16384.0;
        iVar7 = nk_popup_begin(ctx,NK_POPUP_DYNAMIC,"__##Tooltip##__",0x21,rect);
        if (iVar7 != 0) {
          pnVar1 = &pnVar5->layout->flags;
          *pnVar1 = *pnVar1 & 0xffffefff;
        }
        (pnVar5->popup).type = NK_PANEL_TOOLTIP;
        ctx->current->layout->type = NK_PANEL_TOOLTIP;
      }
      return iVar7;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x6209,"int nk_tooltip_begin(struct nk_context *, float)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x6208,"int nk_tooltip_begin(struct nk_context *, float)");
}

Assistant:

NK_API int
nk_tooltip_begin(struct nk_context *ctx, float width)
{
    int x,y,w,h;
    struct nk_window *win;
    const struct nk_input *in;
    struct nk_rect bounds;
    int ret;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* make sure that no nonblocking popup is currently active */
    win = ctx->current;
    in = &ctx->input;
    if (win->popup.win && (win->popup.type & NK_PANEL_SET_NONBLOCK))
        return 0;

    w = nk_iceilf(width);
    h = nk_iceilf(nk_null_rect.h);
    x = nk_ifloorf(in->mouse.pos.x + 1) - (int)win->layout->clip.x;
    y = nk_ifloorf(in->mouse.pos.y + 1) - (int)win->layout->clip.y;

    bounds.x = (float)x;
    bounds.y = (float)y;
    bounds.w = (float)w;
    bounds.h = (float)h;

    ret = nk_popup_begin(ctx, NK_POPUP_DYNAMIC,
        "__##Tooltip##__", NK_WINDOW_NO_SCROLLBAR|NK_WINDOW_BORDER, bounds);
    if (ret) win->layout->flags &= ~(nk_flags)NK_WINDOW_ROM;
    win->popup.type = NK_PANEL_TOOLTIP;
    ctx->current->layout->type = NK_PANEL_TOOLTIP;
    return ret;
}